

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

uint64_t __thiscall llvm::raw_fd_ostream::seek(raw_fd_ostream *this,uint64_t off)

{
  int iVar1;
  uint64_t uVar2;
  int *piVar3;
  error_category *peVar4;
  
  if (this->SupportsSeeking != false) {
    if (*(long *)&this->field_0x18 != *(long *)&this->field_0x8) {
      raw_ostream::flush_nonempty((raw_ostream *)this);
    }
    uVar2 = lseek(this->FD,off,0);
    this->pos = uVar2;
    if (uVar2 == 0xffffffffffffffff) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      peVar4 = (error_category *)std::_V2::generic_category();
      (this->EC)._M_value = iVar1;
      (this->EC)._M_cat = peVar4;
    }
    return uVar2;
  }
  __assert_fail("SupportsSeeking && \"Stream does not support seeking!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x2a4,"uint64_t llvm::raw_fd_ostream::seek(uint64_t)");
}

Assistant:

uint64_t raw_fd_ostream::seek(uint64_t off) {
  assert(SupportsSeeking && "Stream does not support seeking!");
  flush();
#ifdef _WIN32
  pos = ::_lseeki64(FD, off, SEEK_SET);
#elif defined(HAVE_LSEEK64)
  pos = ::lseek64(FD, off, SEEK_SET);
#else
  pos = ::lseek(FD, off, SEEK_SET);
#endif
  if (pos == (uint64_t)-1)
    error_detected(std::error_code(errno, std::generic_category()));
  return pos;
}